

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O0

void rsg::interpolateVertexInput<64>
               (StridedValueAccess<64> dst,int dstComp,ConstValueRangeAccess valueRange,float x,
               float y)

{
  deBool dVar1;
  Type TVar2;
  VariableType *pVVar3;
  TestError *this;
  float *pfVar4;
  float fVar5;
  float x1y1;
  ConstStridedValueAccess<64> local_98;
  ConstValueAccess local_88;
  ConstStridedValueAccess<1> local_78;
  ConstValueAccess local_68;
  ConstStridedValueAccess<1> local_58;
  float local_44;
  float local_40;
  float yd;
  float xd;
  int elementNdx;
  int numElements;
  float local_24;
  float local_20;
  float y_local;
  float x_local;
  int dstComp_local;
  StridedValueAccess<64> dst_local;
  
  dst_local.super_ConstStridedValueAccess<64>.m_type =
       (VariableType *)dst.super_ConstStridedValueAccess<64>.m_value;
  _x_local = dst.super_ConstStridedValueAccess<64>.m_type;
  local_24 = y;
  local_20 = x;
  y_local = (float)dstComp;
  while( true ) {
    dVar1 = ::deGetFalse();
    if (dVar1 != 0) break;
    pVVar3 = ConstValueRangeAccess::getType(&valueRange);
    TVar2 = VariableType::getBaseType(pVVar3);
    if (TVar2 != TYPE_FLOAT) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      pVVar3 = ConstValueRangeAccess::getType(&valueRange);
      xd = (float)VariableType::getNumElements(pVVar3);
      for (yd = 0.0; (int)yd < (int)xd; yd = (float)((int)yd + 1)) {
        getVertexInterpolationCoords(&local_40,&local_44,local_20,local_24,(int)yd);
        local_68 = ConstValueRangeAccess::getMin(&valueRange);
        local_58 = ConstStridedValueAccess<1>::component(&local_68,(int)yd);
        fVar5 = ConstStridedValueAccess<1>::asFloat(&local_58);
        local_88 = ConstValueRangeAccess::getMax(&valueRange);
        local_78 = ConstStridedValueAccess<1>::component(&local_88,(int)yd);
        x1y1 = ConstStridedValueAccess<1>::asFloat(&local_78);
        fVar5 = interpolateVertex(fVar5,x1y1,local_40,local_44);
        local_98 = (ConstStridedValueAccess<64>)
                   StridedValueAccess<64>::component((StridedValueAccess<64> *)&x_local,(int)yd);
        pfVar4 = StridedValueAccess<64>::asFloat((StridedValueAccess<64> *)&local_98,(int)y_local);
        *pfVar4 = fVar5;
      }
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"valueRange.getType().getBaseType() == VariableType::TYPE_FLOAT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
             ,0x8c);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void interpolateVertexInput (StridedValueAccess<Stride> dst, int dstComp, const ConstValueRangeAccess valueRange, float x, float y)
{
	TCU_CHECK(valueRange.getType().getBaseType() == VariableType::TYPE_FLOAT);
	int numElements = valueRange.getType().getNumElements();
	for (int elementNdx = 0; elementNdx < numElements; elementNdx++)
	{
		float xd, yd;
		getVertexInterpolationCoords(xd, yd, x, y, elementNdx);
		dst.component(elementNdx).asFloat(dstComp) = interpolateVertex(valueRange.getMin().component(elementNdx).asFloat(), valueRange.getMax().component(elementNdx).asFloat(), xd, yd);
	}
}